

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_bool>
* __thiscall
pstore::json::details::array_matcher<(anonymous_namespace)::yaml_output>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_bool>
           *__return_storage_ptr__,array_matcher<(anonymous_namespace)::yaml_output> *this,
          parser<(anonymous_namespace)::yaml_output> *parser,maybe<char,_void> *ch)

{
  iterator *piVar1;
  byte bVar2;
  int iVar3;
  _Elt_pointer psVar4;
  _Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
  _Var5;
  bool bVar6;
  byte *pbVar7;
  void *local_20;
  
  if (ch->valid_ == false) {
LAB_001093f4:
    get_error_category();
    matcher<(anonymous_namespace)::yaml_output>::set_error
              (&this->super_matcher<(anonymous_namespace)::yaml_output>,parser,(error_code *)0x1);
LAB_0010940c:
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
    ._M_head_impl = (matcher<(anonymous_namespace)::yaml_output> *)0x0;
LAB_0010941b:
    bVar6 = true;
  }
  else {
    pbVar7 = (byte *)maybe<char,_void>::operator->(ch);
    iVar3 = (this->super_matcher<(anonymous_namespace)::yaml_output>).state_;
    if (4 < iVar3 - 1U) goto LAB_0010940c;
    bVar2 = *pbVar7;
    switch(iVar3) {
    case 1:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x4c6);
    case 2:
      if (bVar2 != 0x5b) {
        assert_failed("c == \'[\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x4a3);
      }
      local_20 = (void *)0x0;
      psVar4 = (parser->callbacks_).out_.c.
               super__Deque_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar4 == *(_Elt_pointer *)
                     ((long)&(parser->callbacks_).out_.c.
                             super__Deque_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
        std::
        deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
        ::_M_push_back_aux<decltype(nullptr)>
                  ((deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
                    *)&parser->callbacks_,&local_20);
      }
      else {
        (psVar4->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (psVar4->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        piVar1 = &(parser->callbacks_).out_.c.
                  super__Deque_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      std::_V2::system_category();
      bVar6 = matcher<(anonymous_namespace)::yaml_output>::set_error
                        (&this->super_matcher<(anonymous_namespace)::yaml_output>,parser,
                         (error_code *)0x0);
      if (bVar6) goto LAB_0010940c;
      (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ = 3;
LAB_001093c0:
      _Var5._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var5._M_head_impl)->terminal + 8) = 2;
      ((_Var5._M_head_impl)->terminal).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_00116c70;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
      ._M_head_impl = (matcher<(anonymous_namespace)::yaml_output> *)&(_Var5._M_head_impl)->terminal
      ;
      goto LAB_0010941b;
    case 3:
      if (bVar2 == 0x5d) goto LAB_001093e7;
    case 4:
      (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ = 5;
      _Var5._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var5._M_head_impl)->root + 8) = 2;
      ((_Var5._M_head_impl)->root).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_00116cb0;
      bVar6 = false;
      *(undefined1 *)((long)&(_Var5._M_head_impl)->root + 0xc) = 0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
      ._M_head_impl = (matcher<(anonymous_namespace)::yaml_output> *)&(_Var5._M_head_impl)->root;
      break;
    case 5:
      if (bVar2 < 0x2d) {
        if ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0) {
          _Var5._M_head_impl =
               (parser->singletons_)._M_t.
               super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
               .
               super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
               ._M_head_impl;
          *(undefined4 *)((long)&(_Var5._M_head_impl)->terminal + 8) = 2;
          ((_Var5._M_head_impl)->terminal).__align =
               (anon_struct_8_0_00000001_for___align)&PTR__matcher_00116c70;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          .
          super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          .
          super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
               = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
                  )0x0;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
          ._M_head_impl =
               (matcher<(anonymous_namespace)::yaml_output> *)&(_Var5._M_head_impl)->terminal;
          bVar6 = false;
          break;
        }
        if ((ulong)bVar2 == 0x2c) {
          (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ =
               ((parser->extensions_ & array_trailing_comma) == none) + 3;
          goto LAB_001093c0;
        }
      }
      if (bVar2 != 0x5d) goto LAB_001093f4;
LAB_001093e7:
      end_array(this,parser);
      goto LAB_0010940c;
    }
  }
  __return_storage_ptr__->second = bVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            array_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_array_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '[');
                    if (this->set_error (parser, parser.callbacks ().begin_array ())) {
                        break;
                    }
                    this->set_state (first_object_state);
                    // Match this character and consume whitespace before the object (or close
                    // bracket).
                    return {this->make_whitespace_matcher (parser), true};

                case first_object_state:
                    if (c == ']') {
                        this->end_array (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case object_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                    break;
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before a comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    switch (c) {
                    case ',':
                        this->set_state (
                            (parser.extension_enabled (extensions::array_trailing_comma))
                                ? first_object_state
                                : object_state);
                        return {this->make_whitespace_matcher (parser), true};
                    case ']': this->end_array (parser); break;
                    default: this->set_error (parser, error_code::expected_array_member); break;
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, true};
            }